

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O1

void pusht_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  long lVar1;
  Btor2Line **ppBVar2;
  long lVar3;
  
  lVar1 = bfr->sztable;
  if (lVar1 <= bfr->ntable) {
    lVar3 = 1;
    if (lVar1 != 0) {
      lVar3 = lVar1 * 2;
    }
    bfr->sztable = lVar3;
    ppBVar2 = (Btor2Line **)btor2parser_realloc(bfr->table,lVar3 << 3);
    bfr->table = ppBVar2;
  }
  lVar1 = bfr->ntable;
  bfr->ntable = lVar1 + 1;
  bfr->table[lVar1] = l;
  return;
}

Assistant:

static void
pusht_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  if (bfr->ntable >= bfr->sztable)
  {
    bfr->sztable = bfr->sztable ? 2 * bfr->sztable : 1;
    bfr->table =
        btor2parser_realloc (bfr->table, bfr->sztable * sizeof *bfr->table);
  }
  bfr->table[bfr->ntable++] = l;
}